

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O2

void __thiscall OS_HttpPayload::add_tstr(OS_HttpPayload *this,char *name,char *val)

{
  OS_HttpPayloadItem *this_00;
  OS_HttpPayload *pOVar1;
  
  this_00 = (OS_HttpPayloadItem *)operator_new(0x28);
  OS_HttpPayloadItem::OS_HttpPayloadItem
            (this_00,name + 2,(ulong)*(ushort *)name,val + 2,(ulong)*(ushort *)val);
  pOVar1 = (OS_HttpPayload *)&this->last_item->nxt;
  if (this->last_item == (OS_HttpPayloadItem *)0x0) {
    pOVar1 = this;
  }
  pOVar1->first_item = this_00;
  this->last_item = this_00;
  return;
}

Assistant:

void OS_HttpPayload::add_tstr(const char *name, const char *val)
{
    add(new OS_HttpPayloadItem(name + VMB_LEN, vmb_get_len(name),
                               val + VMB_LEN, vmb_get_len(val)));
}